

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  undefined7 in_register_00000009;
  byte *pbVar10;
  byte *pbVar11;
  ulong uVar12;
  byte *pbVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  byte *pbVar17;
  long lVar18;
  bool bVar19;
  
  uVar15 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar15 == 1) {
    lVar14 = 1;
    bVar5 = false;
    pbVar10 = (byte *)zNum;
  }
  else {
    uVar7 = 3 - uVar15;
    uVar12 = (ulong)uVar7;
    bVar5 = (int)uVar7 < length;
    if (((int)uVar7 < length) &&
       (uVar12 = 3 - (CONCAT71(in_register_00000009,enc) & 0xffffffff), zNum[uVar12] == '\0')) {
      uVar12 = 5 - (ulong)enc;
      do {
        bVar5 = (long)uVar12 < (long)length;
        if ((long)length <= (long)uVar12) goto LAB_00133f1c;
        uVar1 = uVar12 + 2;
        pcVar2 = zNum + uVar12;
        uVar12 = uVar1;
      } while (*pcVar2 == '\0');
      uVar12 = (ulong)((int)uVar1 - 2);
    }
LAB_00133f1c:
    length = (uint)uVar12 ^ 1;
    pbVar10 = (byte *)(zNum + (uVar15 & 1));
    lVar14 = 2;
  }
  pbVar13 = (byte *)(zNum + length);
  bVar6 = true;
  for (; pbVar11 = pbVar10, pbVar10 < pbVar13; pbVar10 = pbVar10 + lVar14) {
    bVar3 = *pbVar10;
    if ((""[bVar3] & 1) == 0) {
      if (bVar3 == 0x2b) {
        pbVar10 = pbVar10 + lVar14;
        pbVar11 = pbVar10;
      }
      else if (bVar3 == 0x2d) {
        pbVar10 = pbVar10 + lVar14;
        bVar6 = false;
        pbVar11 = pbVar10;
      }
      break;
    }
  }
  for (; (pbVar10 < pbVar13 && (*pbVar10 == 0x30)); pbVar10 = pbVar10 + lVar14) {
  }
  bVar19 = pbVar10 < pbVar13;
  if ((bVar19) && (bVar3 = *pbVar10, (byte)(bVar3 - 0x30) < 10)) {
    lVar9 = 0;
    uVar15 = 0;
    pbVar17 = pbVar10;
    do {
      pbVar17 = pbVar17 + lVar14;
      lVar9 = (ulong)bVar3 + lVar9 * 10 + -0x30;
      uVar15 = uVar15 + (int)lVar14;
      bVar19 = pbVar17 < pbVar13;
      if (!bVar19) break;
      bVar3 = *pbVar17;
    } while ((byte)(bVar3 - 0x30) < 10);
  }
  else {
    lVar9 = 0;
    uVar15 = 0;
  }
  lVar16 = -0x8000000000000000;
  lVar18 = -lVar9;
  if (bVar6) {
    lVar16 = 0x7fffffffffffffff;
    lVar18 = lVar9;
  }
  if (lVar9 < 0) {
    lVar18 = lVar16;
  }
  *pNum = lVar18;
  iVar8 = 1;
  if ((!bVar19) &&
     (((uVar15 != 0 || (pbVar11 != pbVar10)) &&
      (uVar7 = (int)lVar14 * 0x13, !bVar5 && uVar15 <= uVar7)))) {
    if (uVar7 <= uVar15) {
      uVar12 = 0;
      pbVar13 = pbVar10;
      do {
        bVar3 = *pbVar13;
        bVar4 = "922337203685477580"[uVar12];
        if (0x10 < uVar12) break;
        uVar12 = uVar12 + 1;
        pbVar13 = pbVar13 + lVar14;
      } while (bVar3 == bVar4);
      if (bVar3 == bVar4) {
        iVar8 = (char)pbVar10[lVar14 * 0x12] + -0x38;
      }
      else {
        iVar8 = ((int)(char)bVar3 - (int)(char)bVar4) * 10;
      }
      if (-1 < iVar8) {
        if (iVar8 != 0) {
          return 1;
        }
        return (uint)bVar6 * 2;
      }
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  if( u>LARGEST_INT64 ){
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  testcase( i==18 );
  testcase( i==19 );
  testcase( i==20 );
  if( &zNum[i]<zEnd              /* Extra bytes at the end */
   || (i==0 && zStart==zNum)     /* No digits */
   || i>19*incr                  /* Too many digits */
   || nonNum                     /* UTF16 with high-order bytes non-zero */
  ){
    /* zNum is empty or contains non-numeric text or is longer
    ** than 19 digits (thus guaranteeing that it is too large) */
    return 1;
  }else if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return 0;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return 0;
    }else if( c>0 ){
      /* zNum is greater than 9223372036854775808 so it overflows */
      return 1;
    }else{
      /* zNum is exactly 9223372036854775808.  Fits if negative.  The
      ** special case 2 overflow if positive */
      assert( u-1==LARGEST_INT64 );
      return neg ? 0 : 2;
    }
  }
}